

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  int iVar1;
  int mx;
  ImVector<unsigned_short> *this;
  unsigned_short *puVar2;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar3;
  ImWchar *text;
  int new_text_len_utf8;
  int text_len;
  bool is_resizable;
  int new_size;
  ImWchar *in_stack_ffffffffffffffc8;
  long lVar4;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  bool local_1;
  
  bVar3 = (*(uint *)(in_RDI + 0xe80) & 0x40000) != 0;
  new_size = *(int *)(in_RDI + 4);
  iVar1 = ImTextCountUtf8BytesFromStr
                    ((ImWchar *)CONCAT44(new_size,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if ((bVar3) || (iVar1 + *(int *)(in_RDI + 8) + 1 <= *(int *)(in_RDI + 0x44))) {
    iVar5 = new_size;
    if (*(int *)(in_RDI + 0x10) < in_ECX + new_size + 1) {
      if (!bVar3) {
        return false;
      }
      this = (ImVector<unsigned_short> *)(in_RDI + 0x10);
      mx = ImMax<int>(0x100,in_ECX);
      ImClamp<int>(in_ECX << 2,0x20,mx);
      ImVector<unsigned_short>::resize(this,new_size);
    }
    lVar4 = *(long *)(in_RDI + 0x18);
    if (in_ESI != iVar5) {
      memmove((void *)(lVar4 + (long)in_ESI * 2 + (long)in_ECX * 2),
              (void *)(lVar4 + (long)in_ESI * 2),(long)(iVar5 - in_ESI) << 1);
    }
    memcpy((void *)(lVar4 + (long)in_ESI * 2),in_RDX,(long)in_ECX << 1);
    *(undefined1 *)(in_RDI + 0xe7e) = 1;
    *(int *)(in_RDI + 4) = in_ECX + *(int *)(in_RDI + 4);
    *(int *)(in_RDI + 8) = iVar1 + *(int *)(in_RDI + 8);
    puVar2 = ImVector<unsigned_short>::operator[]
                       ((ImVector<unsigned_short> *)(in_RDI + 0x10),*(int *)(in_RDI + 4));
    *puVar2 = 0;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->Flags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->Edited = true;
    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}